

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

void __thiscall
ninx::parser::element::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,string *name,
          vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
          *arguments,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  pointer puVar1;
  string *psVar2;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *puVar3;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  pointer puVar4;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *__range1;
  
  (this->super_Statement).super_ASTElement.parent = (Block *)0x0;
  (this->super_Statement).super_ASTElement.__output_block = (Block *)0x0;
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__FunctionDefinition_0014f2e8;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  puVar4 = (arguments->
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (arguments->
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (arguments->
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->body)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
       (body->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
       .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (body->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = (Block *)0x0;
  *(undefined8 *)&(this->evaluator).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->evaluator).super__Function_base._M_functor + 8) = 0;
  (this->evaluator)._M_invoker =
       std::
       _Function_handler<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>),_ninx::parser::element::FunctionDefinition::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/element/FunctionDefinition.h:84:111)>
       ::_M_invoke;
  (this->evaluator).super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>),_ninx::parser::element::FunctionDefinition::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/element/FunctionDefinition.h:84:111)>
       ::_M_manager;
  (this->mandatory_arguments)._M_h._M_buckets = &(this->mandatory_arguments)._M_h._M_single_bucket;
  (this->mandatory_arguments)._M_h._M_bucket_count = 1;
  (this->mandatory_arguments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mandatory_arguments)._M_h._M_element_count = 0;
  (this->mandatory_arguments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mandatory_arguments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mandatory_arguments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_argument_name_cache)._M_h._M_buckets = &(this->_argument_name_cache)._M_h._M_single_bucket
  ;
  (this->_argument_name_cache)._M_h._M_bucket_count = 1;
  (this->_argument_name_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_argument_name_cache)._M_h._M_element_count = 0;
  (this->_argument_name_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_argument_name_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_argument_name_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->arguments).
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    psVar2 = FunctionArgument::get_name_abi_cxx11_
                       ((puVar4->_M_t).
                        super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                        .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                        _M_head_impl);
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->_argument_name_cache,psVar2);
    puVar3 = FunctionArgument::get_default_value
                       ((puVar4->_M_t).
                        super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                        .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                        _M_head_impl);
    if ((puVar3->_M_t).
        super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl ==
        (Expression *)0x0) {
      psVar2 = FunctionArgument::get_name_abi_cxx11_
                         ((puVar4->_M_t).
                          super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                          .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                          _M_head_impl);
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->mandatory_arguments,psVar2);
    }
  }
  return;
}

Assistant:

ninx::parser::element::FunctionDefinition::FunctionDefinition(const std::string &name,
                                                              std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument>> arguments,
                                                              std::unique_ptr<ninx::parser::element::Block> body)
        : name(name), arguments(std::move(arguments)), body(std::move(body)) {

    // Populate the caches
    for (auto &argument : this->arguments) {
        this->_argument_name_cache.insert(argument->get_name());

        if (!argument->get_default_value()) {
            this->mandatory_arguments.insert(argument->get_name());
        }
    }
}